

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O2

void Rwt_ManLoadFromArray(Rwt_Man_t *p,int fVerbose)

{
  ushort uVar1;
  ushort uVar2;
  void **ppvVar3;
  Rwt_Node_t *p0;
  Rwt_Node_t *p1;
  uint uVar4;
  int iVar5;
  abctime aVar6;
  abctime aVar7;
  ushort *puVar8;
  uint uVar9;
  uint local_54;
  
  local_54 = 0xffffffff;
  puVar8 = s_RwtAigSubgraphs + 1;
  aVar6 = Abc_Clock();
  while( true ) {
    uVar1 = puVar8[-1];
    uVar2 = *puVar8;
    if (uVar1 == 0 && uVar2 == 0) break;
    ppvVar3 = p->vForest->pArray;
    p0 = *(Rwt_Node_t **)((long)ppvVar3 + (ulong)(uVar1 & 0xfffffffc) * 2);
    p1 = *(Rwt_Node_t **)((long)ppvVar3 + (ulong)(uVar2 & 0xfffffffe) * 4);
    uVar4 = (byte)p0->field_0xb & 0x3f;
    uVar9 = (byte)p1->field_0xb & 0x3f;
    if (uVar9 < uVar4) {
      uVar9 = uVar4;
    }
    iVar5 = Rwt_ManNodeVolume(p,p0,p1);
    Rwt_ManAddNode(p,(Rwt_Node_t *)((ulong)(uVar1 >> 1 & 1) ^ (ulong)p0),
                   (Rwt_Node_t *)((ulong)(uVar2 & 1) ^ (ulong)p1),uVar1 & 1,uVar9 + 1,
                   iVar5 + (uVar1 & 1) + 1);
    local_54 = local_54 + 1;
    puVar8 = puVar8 + 2;
  }
  if (fVerbose != 0) {
    printf("The number of classes = %d. Canonical nodes = %d.\n",(ulong)(uint)p->nClasses,
           (ulong)(uint)p->nAdded);
    iVar5 = 0x801f50;
    printf("The number of nodes loaded = %d.  ",(ulong)local_54);
    Abc_Print(iVar5,"%s =","Loading");
    aVar7 = Abc_Clock();
    Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar7 - aVar6) / 1000000.0);
    return;
  }
  return;
}

Assistant:

void Rwt_ManLoadFromArray( Rwt_Man_t * p, int fVerbose )
{
    unsigned short * pArray = s_RwtAigSubgraphs;
    Rwt_Node_t * p0, * p1;
    unsigned Entry0, Entry1;
    int Level, Volume, nEntries, fExor;
    int i;
    abctime clk = Abc_Clock();

    // reconstruct the forest
    for ( i = 0; ; i++ )
    {
        Entry0 = pArray[2*i + 0];
        Entry1 = pArray[2*i + 1];
        if ( Entry0 == 0 && Entry1 == 0 )
            break;
        // get EXOR flag
        fExor = (Entry0 & 1);
        Entry0 >>= 1;
        // get the nodes
        p0 = (Rwt_Node_t *)p->vForest->pArray[Entry0 >> 1];
        p1 = (Rwt_Node_t *)p->vForest->pArray[Entry1 >> 1];
        // compute the level and volume of the new nodes
        Level  = 1 + RWT_MAX( p0->Level, p1->Level );
        Volume = 1 + Rwt_ManNodeVolume( p, p0, p1 );
        // set the complemented attributes
        p0 = Rwt_NotCond( p0, (Entry0 & 1) );
        p1 = Rwt_NotCond( p1, (Entry1 & 1) );
        // add the node
//        Rwt_ManTryNode( p, p0, p1, Level, Volume );
        Rwt_ManAddNode( p, p0, p1, fExor, Level, Volume + fExor );
    }
    nEntries = i - 1;
    if ( fVerbose )
    {
        printf( "The number of classes = %d. Canonical nodes = %d.\n", p->nClasses, p->nAdded );
        printf( "The number of nodes loaded = %d.  ", nEntries );  ABC_PRT( "Loading", Abc_Clock() - clk );
    }
}